

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_mapper.cpp
# Opt level: O0

UnlocalizedNumberFormatter *
icu_63::number::impl::NumberPropertyMapper::create
          (UnlocalizedNumberFormatter *__return_storage_ptr__,DecimalFormatProperties *properties,
          DecimalFormatSymbols *symbols,DecimalFormatWarehouse *warehouse,UErrorCode *status)

{
  MacroProps local_3b8;
  UnlocalizedNumberFormatter local_1f8;
  UErrorCode *local_30;
  UErrorCode *status_local;
  DecimalFormatWarehouse *warehouse_local;
  DecimalFormatSymbols *symbols_local;
  DecimalFormatProperties *properties_local;
  
  local_30 = status;
  status_local = (UErrorCode *)warehouse;
  warehouse_local = (DecimalFormatWarehouse *)symbols;
  symbols_local = (DecimalFormatSymbols *)properties;
  properties_local = (DecimalFormatProperties *)__return_storage_ptr__;
  NumberFormatter::with();
  oldToNew(&local_3b8,(DecimalFormatProperties *)symbols_local,
           (DecimalFormatSymbols *)warehouse_local,(DecimalFormatWarehouse *)status_local,
           (DecimalFormatProperties *)0x0,local_30);
  NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>::macros
            (__return_storage_ptr__,
             &local_1f8.super_NumberFormatterSettings<icu_63::number::UnlocalizedNumberFormatter>,
             &local_3b8);
  MacroProps::~MacroProps(&local_3b8);
  UnlocalizedNumberFormatter::~UnlocalizedNumberFormatter(&local_1f8);
  return __return_storage_ptr__;
}

Assistant:

UnlocalizedNumberFormatter NumberPropertyMapper::create(const DecimalFormatProperties& properties,
                                                        const DecimalFormatSymbols& symbols,
                                                        DecimalFormatWarehouse& warehouse,
                                                        UErrorCode& status) {
    return NumberFormatter::with().macros(oldToNew(properties, symbols, warehouse, nullptr, status));
}